

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_Xform * Internal_ON_Xform_Init(ON_Xform *__return_storage_ptr__,double x,bool bDiagonal)

{
  ulong uVar1;
  undefined3 in_register_00000031;
  
  ON_Xform::ON_Xform(__return_storage_ptr__);
  __return_storage_ptr__->m_xform[3][2] = 0.0;
  __return_storage_ptr__->m_xform[3][3] = 0.0;
  __return_storage_ptr__->m_xform[3][0] = 0.0;
  __return_storage_ptr__->m_xform[3][1] = 0.0;
  __return_storage_ptr__->m_xform[2][2] = 0.0;
  __return_storage_ptr__->m_xform[2][3] = 0.0;
  __return_storage_ptr__->m_xform[2][0] = 0.0;
  __return_storage_ptr__->m_xform[2][1] = 0.0;
  __return_storage_ptr__->m_xform[1][2] = 0.0;
  __return_storage_ptr__->m_xform[1][3] = 0.0;
  __return_storage_ptr__->m_xform[1][0] = 0.0;
  __return_storage_ptr__->m_xform[1][1] = 0.0;
  __return_storage_ptr__->m_xform[0][2] = 0.0;
  __return_storage_ptr__->m_xform[0][3] = 0.0;
  __return_storage_ptr__->m_xform[0][0] = 0.0;
  __return_storage_ptr__->m_xform[0][1] = 0.0;
  if (CONCAT31(in_register_00000031,bDiagonal) == 0) {
    for (uVar1 = 0; uVar1 < 0x80; uVar1 = uVar1 + 8) {
      *(double *)((long)__return_storage_ptr__->m_xform[0] + uVar1) = x;
    }
  }
  else {
    __return_storage_ptr__->m_xform[0][0] = x;
    __return_storage_ptr__->m_xform[1][1] = x;
    __return_storage_ptr__->m_xform[2][2] = x;
    __return_storage_ptr__->m_xform[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

static ON_Xform Internal_ON_Xform_Init(double x, bool bDiagonal)
{
  ON_Xform xform;
  memset(&xform, 0, sizeof(xform));
  if (bDiagonal)
  {
    xform.m_xform[0][0] = x;
    xform.m_xform[1][1] = x;
    xform.m_xform[2][2] = x;
    xform.m_xform[3][3] = 1.0;
  }
  else
  {
    double* p = &xform.m_xform[0][0];
    double* p1 = p + 16;
    while (p < p1)
      *p++ = x;
  }
  return xform;
}